

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

token_t __thiscall grammar::next_terminal(grammar *this)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var2 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = p_Var2;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    while (p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1),
          (_Rb_tree_header *)p_Var1 != p_Var3) {
      if ((int)p_Var1[1]._M_color < (int)p_Var2[1]._M_color) {
        p_Var2 = p_Var1;
      }
    }
  }
  return (token_t)(p_Var2[1]._M_color - _S_black);
}

Assistant:

token_t grammar::next_terminal() const {
    return std::min_element(
               symbols.begin(), symbols.end(),
               [](auto & lhs, auto & rhs) { return lhs.first < rhs.first; })
               ->first
           - 1;
}